

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void google::protobuf::internal::MapMergeFrom<std::__cxx11::string,proto2_unittest::TestAllTypes>
               (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestAllTypes>
                *dest,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestAllTypes>
                      *src)

{
  NodeBase *pNVar1;
  uint uVar2;
  ulong uVar3;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_proto2_unittest::TestAllTypes>::iterator,_bool>
  local_50;
  
  uVar2 = (src->
          super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_UntypedMapBase.index_of_first_non_null_;
  uVar3 = (ulong)uVar2;
  if (uVar2 == (src->
               super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).super_UntypedMapBase.num_buckets_) {
    uVar3 = 0;
    pNVar1 = (NodeBase *)0x0;
  }
  else {
    pNVar1 = (src->
             super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).super_UntypedMapBase.table_[uVar3];
    if (pNVar1 == (NodeBase *)0x0) {
      protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  if (pNVar1 != (NodeBase *)0x0) {
    do {
      Map<std::__cxx11::string,proto2_unittest::TestAllTypes>::
      TryEmplaceInternal<std::__cxx11::string_const&>
                (&local_50,dest,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pNVar1 + 1));
      proto2_unittest::TestAllTypes::CopyFrom
                ((TestAllTypes *)(local_50.first.super_UntypedMapIterator.node_ + 5),
                 (TestAllTypes *)(pNVar1 + 5));
      pNVar1 = pNVar1->next;
      if (pNVar1 == (NodeBase *)0x0) {
        do {
          uVar2 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar2;
          if ((src->
              super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).super_UntypedMapBase.num_buckets_ <= uVar2) {
            pNVar1 = (NodeBase *)0x0;
            uVar3 = 0;
            break;
          }
          pNVar1 = (src->
                   super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).super_UntypedMapBase.table_[uVar2];
        } while (pNVar1 == (NodeBase *)0x0);
      }
    } while (pNVar1 != (NodeBase *)0x0);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}